

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pytypes.h
# Opt level: O2

void __thiscall pybind11::str::str(str *this,handle h)

{
  PyObject *pPVar1;
  error_already_set *this_00;
  
  pPVar1 = (PyObject *)PyObject_Str(h.m_ptr);
  (this->super_object).super_handle.m_ptr = pPVar1;
  if (pPVar1 != (PyObject *)0x0) {
    return;
  }
  this_00 = (error_already_set *)__cxa_allocate_exception(0x18);
  error_already_set::error_already_set(this_00);
  __cxa_throw(this_00,&error_already_set::typeinfo,error_already_set::~error_already_set);
}

Assistant:

explicit str(handle h) : object(raw_str(h.ptr()), stolen_t{}) {
        if (!m_ptr) {
            throw error_already_set();
        }
    }